

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void add_ref_mv_candidate
               (MB_MODE_INFO *candidate,MV_REFERENCE_FRAME *rf,uint8_t *refmv_count,
               uint8_t *ref_match_count,uint8_t *newmv_count,CANDIDATE_MV *ref_mv_stack,
               uint16_t *ref_mv_weight,int_mv *gm_mv_candidates,WarpedMotionParams *gm_params,
               uint16_t weight)

{
  PREDICTION_MODE PVar1;
  int_mv iVar2;
  CANDIDATE_MV CVar3;
  byte bVar4;
  int_mv *piVar5;
  uint uVar6;
  int_mv *piVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  int_mv local_40 [4];
  int_mv this_refmv [2];
  
  if (((candidate->field_0xa7 & 0x80) != 0) || ('\0' < candidate->ref_frame[0])) {
    if (rf[1] == -1) {
      lVar9 = 0;
      do {
        if (candidate->ref_frame[lVar9] == *rf) {
          bVar4 = block_size_high[candidate->bsize];
          if (block_size_wide[candidate->bsize] < block_size_high[candidate->bsize]) {
            bVar4 = block_size_wide[candidate->bsize];
          }
          piVar7 = candidate->mv + lVar9;
          piVar5 = gm_mv_candidates;
          if (bVar4 < 8) {
            piVar5 = piVar7;
          }
          if ((candidate->mode - 0xf & 0xf7) != 0) {
            piVar5 = piVar7;
          }
          if (gm_params[*rf].wmtype < 2) {
            piVar5 = piVar7;
          }
          iVar2 = (int_mv)piVar5->as_int;
          bVar4 = *refmv_count;
          uVar6 = (uint)bVar4;
          if (bVar4 == 0) {
            uVar6 = 0;
          }
          else {
            uVar8 = 0;
            do {
              if (ref_mv_stack[uVar8].this_mv.as_int == iVar2.as_int) {
                ref_mv_weight[uVar8] = ref_mv_weight[uVar8] + weight;
                uVar6 = (uint)uVar8;
                break;
              }
              uVar8 = uVar8 + 1;
            } while (bVar4 != uVar8);
          }
          if (uVar6 == *refmv_count && *refmv_count < 8) {
            ref_mv_stack[uVar6].this_mv = iVar2;
            ref_mv_weight[uVar6] = weight;
            *refmv_count = *refmv_count + '\x01';
          }
          if ((candidate->mode < 0x19) && ((0x1790000U >> (candidate->mode & 0x1f) & 1) != 0)) {
            *newmv_count = *newmv_count + '\x01';
          }
          *ref_match_count = *ref_match_count + '\x01';
        }
        bVar10 = lVar9 == 0;
        lVar9 = lVar9 + 1;
      } while (bVar10);
    }
    else if ((candidate->ref_frame[0] == *rf) && (candidate->ref_frame[1] == rf[1])) {
      PVar1 = candidate->mode;
      bVar4 = block_size_high[candidate->bsize];
      if (block_size_wide[candidate->bsize] < block_size_high[candidate->bsize]) {
        bVar4 = block_size_wide[candidate->bsize];
      }
      piVar7 = candidate->mv;
      lVar9 = 0;
      do {
        piVar5 = gm_mv_candidates;
        if (bVar4 < 8) {
          piVar5 = piVar7;
        }
        if ((PVar1 - 0xf & 0xf7) != 0) {
          piVar5 = piVar7;
        }
        if (gm_params[rf[lVar9]].wmtype < 2) {
          piVar5 = piVar7;
        }
        local_40[lVar9] = *piVar5;
        lVar9 = lVar9 + 1;
        gm_mv_candidates = gm_mv_candidates + 1;
        piVar7 = piVar7 + 1;
      } while (lVar9 == 1);
      bVar4 = *refmv_count;
      uVar6 = (uint)bVar4;
      if (bVar4 == 0) {
        uVar6 = 0;
      }
      else {
        uVar8 = 0;
        do {
          if ((ref_mv_stack[uVar8].this_mv.as_int == local_40[0].as_int) &&
             (ref_mv_stack[uVar8].comp_mv.as_int == local_40[1].as_int)) {
            ref_mv_weight[uVar8] = ref_mv_weight[uVar8] + weight;
            uVar6 = (uint)uVar8;
            break;
          }
          uVar8 = uVar8 + 1;
        } while (bVar4 != uVar8);
      }
      if (uVar6 == *refmv_count && *refmv_count < 8) {
        CVar3.comp_mv.as_int = local_40[1].as_int;
        CVar3.this_mv.as_int = local_40[0].as_int;
        ref_mv_stack[uVar6] = CVar3;
        ref_mv_weight[uVar6] = weight;
        *refmv_count = *refmv_count + '\x01';
      }
      if ((candidate->mode < 0x19) && ((0x1790000U >> (candidate->mode & 0x1f) & 1) != 0)) {
        *newmv_count = *newmv_count + '\x01';
      }
      *ref_match_count = *ref_match_count + '\x01';
    }
  }
  return;
}

Assistant:

static inline void add_ref_mv_candidate(
    const MB_MODE_INFO *const candidate, const MV_REFERENCE_FRAME rf[2],
    uint8_t *refmv_count, uint8_t *ref_match_count, uint8_t *newmv_count,
    CANDIDATE_MV *ref_mv_stack, uint16_t *ref_mv_weight,
    int_mv *gm_mv_candidates, const WarpedMotionParams *gm_params,
    uint16_t weight) {
  if (!is_inter_block(candidate)) return;
  assert(weight % 2 == 0);
  int index, ref;

  if (rf[1] == NONE_FRAME) {
    // single reference frame
    for (ref = 0; ref < 2; ++ref) {
      if (candidate->ref_frame[ref] == rf[0]) {
        const int is_gm_block =
            is_global_mv_block(candidate, gm_params[rf[0]].wmtype);
        const int_mv this_refmv =
            is_gm_block ? gm_mv_candidates[0] : get_block_mv(candidate, ref);
        for (index = 0; index < *refmv_count; ++index) {
          if (ref_mv_stack[index].this_mv.as_int == this_refmv.as_int) {
            ref_mv_weight[index] += weight;
            break;
          }
        }

        // Add a new item to the list.
        if (index == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
          ref_mv_stack[index].this_mv = this_refmv;
          ref_mv_weight[index] = weight;
          ++(*refmv_count);
        }
        if (have_newmv_in_inter_mode(candidate->mode)) ++*newmv_count;
        ++*ref_match_count;
      }
    }
  } else {
    // compound reference frame
    if (candidate->ref_frame[0] == rf[0] && candidate->ref_frame[1] == rf[1]) {
      int_mv this_refmv[2];

      for (ref = 0; ref < 2; ++ref) {
        if (is_global_mv_block(candidate, gm_params[rf[ref]].wmtype))
          this_refmv[ref] = gm_mv_candidates[ref];
        else
          this_refmv[ref] = get_block_mv(candidate, ref);
      }

      for (index = 0; index < *refmv_count; ++index) {
        if ((ref_mv_stack[index].this_mv.as_int == this_refmv[0].as_int) &&
            (ref_mv_stack[index].comp_mv.as_int == this_refmv[1].as_int)) {
          ref_mv_weight[index] += weight;
          break;
        }
      }

      // Add a new item to the list.
      if (index == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
        ref_mv_stack[index].this_mv = this_refmv[0];
        ref_mv_stack[index].comp_mv = this_refmv[1];
        ref_mv_weight[index] = weight;
        ++(*refmv_count);
      }
      if (have_newmv_in_inter_mode(candidate->mode)) ++*newmv_count;
      ++*ref_match_count;
    }
  }
}